

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts mul_floats(FloatParts a,FloatParts b,float_status *s)

{
  ulong uVar1;
  FloatParts a_00;
  _Bool _Var2;
  FloatParts FVar3;
  int local_5c;
  undefined4 uStack_58;
  int exp;
  uint64_t lo;
  uint64_t hi;
  float_status *pfStack_40;
  _Bool sign;
  float_status *s_local;
  FloatParts b_local;
  FloatParts a_local;
  ulong local_10;
  
  s_local = (float_status *)b.frac;
  b_local._8_8_ = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_1_ = a.cls;
  a_local.frac._5_1_ = a.sign;
  a_local.frac._6_2_ = a._14_2_;
  b_local.frac._0_4_ = b.exp;
  b_local.frac._4_1_ = b.cls;
  b_local.frac._5_1_ = b.sign;
  b_local.frac._6_2_ = b._14_2_;
  hi._7_1_ = (a_local.frac._5_1_ & 1U) != (b_local.frac._5_1_ & 1);
  pfStack_40 = s;
  if ((a_local.frac._4_1_ == float_class_normal) && (b_local.frac._4_1_ == float_class_normal)) {
    local_5c = (int)a_local.frac + (int)b_local.frac;
    mul64To128(b_local._8_8_,(uint64_t)s_local,&lo,(uint64_t *)&stack0xffffffffffffffa8);
    shift128RightJamming(lo,_uStack_58,0x3e,&lo,(uint64_t *)&stack0xffffffffffffffa8);
    if ((_uStack_58 & 0x8000000000000000) != 0) {
      shift64RightJamming(_uStack_58,1,(uint64_t *)&stack0xffffffffffffffa8);
      local_5c = local_5c + 1;
    }
    uVar1 = CONCAT26(a_local.frac._6_2_,CONCAT15(hi._7_1_,CONCAT14(2,local_5c))) &
            0xffff01ffffffffff;
    local_10._0_4_ = (int)uVar1;
    local_10._4_1_ = (char)(uVar1 >> 0x20);
    local_10._5_1_ = (_Bool)(char)(uVar1 >> 0x28);
    local_10._6_2_ = (short)(uVar1 >> 0x30);
    a_local.exp = uStack_58;
    a_local.cls = (undefined1)exp;
    a_local.sign = (_Bool)exp._1_1_;
    a_local._14_2_ = exp._2_2_;
  }
  else {
    _Var2 = is_nan(a_local.frac._4_1_);
    if ((!_Var2) && (_Var2 = is_nan(b_local.frac._4_1_), !_Var2)) {
      if (((a_local.frac._4_1_ == float_class_inf) && (b_local.frac._4_1_ == float_class_zero)) ||
         ((a_local.frac._4_1_ == float_class_zero && (b_local.frac._4_1_ == float_class_inf)))) {
        pfStack_40->float_exception_flags = pfStack_40->float_exception_flags | 1;
        FVar3 = parts_default_nan(pfStack_40);
        return FVar3;
      }
      if ((a_local.frac._4_1_ == float_class_inf) || (a_local.frac._4_1_ == float_class_zero)) {
        uVar1 = CONCAT26(a_local.frac._6_2_,CONCAT15(hi._7_1_,a._8_5_)) & 0xffff01ffffffffff;
        local_10._0_4_ = (int)uVar1;
        local_10._4_1_ = (char)(uVar1 >> 0x20);
        local_10._5_1_ = (_Bool)(char)(uVar1 >> 0x28);
        local_10._6_2_ = (short)(uVar1 >> 0x30);
        a_local.exp = b_local.exp;
        a_local.cls = b_local.cls;
        a_local.sign = b_local.sign;
        a_local._14_2_ = b_local._14_2_;
        return stack0xffffffffffffffe8;
      }
      if ((b_local.frac._4_1_ != float_class_inf) && (b_local.frac._4_1_ != float_class_zero)) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                   ,0x4e6,(char *)0x0);
      }
      uVar1 = CONCAT26(b_local.frac._6_2_,
                       CONCAT15(hi._7_1_,CONCAT14(b_local.frac._4_1_,(int)b_local.frac))) &
              0xffff01ffffffffff;
      local_10._0_4_ = (int)uVar1;
      local_10._4_1_ = (char)(uVar1 >> 0x20);
      local_10._5_1_ = (_Bool)(char)(uVar1 >> 0x28);
      local_10._6_2_ = (short)(uVar1 >> 0x30);
      a_local._8_8_ = s_local;
      return stack0xffffffffffffffe8;
    }
    a_00.exp = (int)a_local.frac;
    a_00.frac._0_4_ = b_local.exp;
    a_00.frac._4_1_ = b_local.cls;
    a_00.frac._5_1_ = b_local.sign;
    a_00.frac._6_2_ = b_local._14_2_;
    a_00.cls = a_local.frac._4_1_;
    a_00.sign = a_local.frac._5_1_;
    a_00._14_2_ = a_local.frac._6_2_;
    FVar3.exp = (int)b_local.frac;
    FVar3.frac = (uint64_t)s_local;
    FVar3.cls = b_local.frac._4_1_;
    FVar3.sign = (_Bool)b_local.frac._5_1_;
    FVar3._14_2_ = b_local.frac._6_2_;
    join_0x00000010_0x00000000_ = pick_nan(a_00,FVar3,pfStack_40);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts mul_floats(FloatParts a, FloatParts b, float_status *s)
{
    bool sign = a.sign ^ b.sign;

    if (a.cls == float_class_normal && b.cls == float_class_normal) {
        uint64_t hi, lo;
        int exp = a.exp + b.exp;

        mul64To128(a.frac, b.frac, &hi, &lo);
        shift128RightJamming(hi, lo, DECOMPOSED_BINARY_POINT, &hi, &lo);
        if (lo & DECOMPOSED_OVERFLOW_BIT) {
            shift64RightJamming(lo, 1, &lo);
            exp += 1;
        }

        /* Re-use a */
        a.exp = exp;
        a.sign = sign;
        a.frac = lo;
        return a;
    }
    /* handle all the NaN cases */
    if (is_nan(a.cls) || is_nan(b.cls)) {
        return pick_nan(a, b, s);
    }
    /* Inf * Zero == NaN */
    if ((a.cls == float_class_inf && b.cls == float_class_zero) ||
        (a.cls == float_class_zero && b.cls == float_class_inf)) {
        s->float_exception_flags |= float_flag_invalid;
        return parts_default_nan(s);
    }
    /* Multiply by 0 or Inf */
    if (a.cls == float_class_inf || a.cls == float_class_zero) {
        a.sign = sign;
        return a;
    }
    if (b.cls == float_class_inf || b.cls == float_class_zero) {
        b.sign = sign;
        return b;
    }

    g_assert_not_reached();
    return a;
}